

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalc.cpp
# Opt level: O1

void __thiscall aalcalc::outputrows(aalcalc *this,char *buffer,int strLen,FILE *fout)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int extraout_EDX;
  int iVar5;
  char *pcVar6;
  uint uVar7;
  ulong uVar8;
  char *pcVar9;
  aalcalc *this_00;
  ulong uVar10;
  uint *puVar11;
  double dVar12;
  char acStack_1070 [4104];
  char *pcStack_68;
  char *pcStack_60;
  char *pcStack_58;
  FILE *pFStack_50;
  ulong uStack_48;
  code *pcStack_40;
  
  uVar8 = (ulong)(uint)strLen;
  uVar10 = 1;
  pcVar6 = buffer;
  while( true ) {
    pcVar9 = "%s";
    pcStack_40 = (code *)0x104dad;
    uVar2 = fprintf((FILE *)fout,"%s",pcVar6);
    if ((int)uVar2 < 0) {
      pcStack_40 = outputresultscsv_new<aal_rec>;
      this_00 = (aalcalc *)buffer;
      outputrows((aalcalc *)buffer);
      pcStack_60 = "%s";
      puVar11 = *(uint **)pcVar9;
      if (puVar11 != *(uint **)(pcVar9 + 8)) {
        iVar5 = extraout_EDX * this_00->no_of_periods_;
        pcStack_68 = pcVar6;
        pcStack_58 = buffer;
        pFStack_50 = fout;
        uStack_48 = uVar10;
        pcStack_40 = (code *)uVar8;
        do {
          if (0 < (int)*puVar11) {
            iVar3 = this_00->no_of_periods_;
            dVar1 = *(double *)(puVar11 + 2);
            dVar12 = (*(double *)(puVar11 + 4) - (dVar1 * dVar1) / (double)iVar5) /
                     (double)(iVar5 + -1);
            if (dVar12 < 0.0) {
              dVar12 = sqrt(dVar12);
            }
            else {
              dVar12 = SQRT(dVar12);
            }
            iVar3 = snprintf(acStack_1070,0x1000,"%d,%d,%f,%f",
                             (dVar1 / (double)extraout_EDX) / (double)iVar3,dVar12,(ulong)*puVar11,
                             (ulong)puVar11[1]);
            if ((this_00->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish !=
                (this_00->sidxtoensemble_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start) {
              iVar4 = snprintf(acStack_1070 + iVar3,(long)(0x1000 - iVar3),",0");
              iVar3 = iVar3 + iVar4;
            }
            iVar4 = snprintf(acStack_1070 + iVar3,(long)(0x1000 - iVar3),"\n");
            outputrows(this_00,acStack_1070,iVar3 + iVar4,_stdout);
          }
          puVar11 = puVar11 + 6;
        } while (puVar11 != *(uint **)(pcVar9 + 8));
      }
      return;
    }
    iVar5 = (int)uVar8;
    uVar7 = iVar5 - uVar2;
    uVar8 = (ulong)uVar7;
    if (uVar7 == 0 || iVar5 < (int)uVar2) break;
    pcVar6 = pcVar6 + uVar2;
    pcStack_40 = (code *)0x104dd8;
    fprintf(_stderr,"INFO: Attempt %d to write %s\n",uVar10,buffer);
    uVar2 = (int)uVar10 + 1;
    uVar10 = (ulong)uVar2;
    if (uVar2 == 0xb) {
      pcStack_40 = (code *)0x104de9;
      outputrows((aalcalc *)buffer);
      return;
    }
  }
  return;
}

Assistant:

inline void aalcalc::outputrows(const char * buffer, int strLen, FILE * fout) {

	const char * bufPtr = buffer;
	int num;
	int counter = 0;
	do {

		num = fprintf(fout, "%s", bufPtr);
		if (num < 0) {   // Write error
			fprintf(stderr, "FATAL: Error writing %s: %s\n",
				buffer, strerror(errno));
			exit(EXIT_FAILURE);
		} else if (num < strLen) {   // Incomplete write
			bufPtr += num;
			strLen -= num;
		} else return;   // Success

		fprintf(stderr, "INFO: Attempt %d to write %s\n", ++counter,
			buffer);

	} while (counter < 10);

	fprintf(stderr, "FATAL: Maximum attempts to write %s exceeded\n",
		buffer);
	exit(EXIT_FAILURE);

}